

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server2.cpp
# Opt level: O1

int newUser(string *cmd,int socket_fd)

{
  _Iter_pred<newUser(std::__cxx11::string,int)::__0> *this;
  char cVar1;
  bool bVar2;
  ssize_t sVar3;
  ostream *poVar4;
  int iVar5;
  long lVar6;
  __normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_> __it;
  undefined8 __it_00;
  long local_318;
  ofstream usersFile;
  ios_base local_220 [264];
  char *local_118;
  string password;
  vector<User,_std::allocator<User>_> users;
  long local_d8;
  undefined1 local_d0 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  uint local_90 [2];
  undefined4 uStack_88;
  undefined4 uStack_84;
  char *local_80;
  string username;
  undefined1 local_50 [8];
  undefined4 uStack_48;
  undefined4 uStack_44;
  anon_struct_64_2_84df61a8 *local_40;
  int local_34;
  
  std::__cxx11::string::find((char *)cmd,0x1091e5,0);
  std::__cxx11::string::substr((ulong)&local_80,(ulong)cmd);
  std::__cxx11::string::substr((ulong)&local_118,(ulong)cmd);
  std::ofstream::ofstream(&local_318,"../users.txt",_S_app);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Could not open user.txt file",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    iVar5 = -1;
    std::ostream::flush();
    goto LAB_001069bb;
  }
  getUsers();
  if ((username._M_dataplus._M_p < (pointer)0x20) && (password._M_dataplus._M_p + -4 < (pointer)0x5)
     ) {
    local_40 = users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data
               ._M_start;
    users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)local_d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               &users.super__Vector_base<User,_std::allocator<User>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_80,
               username._M_dataplus._M_p + (long)local_80);
    local_a0._M_allocated_capacity = (size_type)local_90;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_d0 + 0x30),
               users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data
               ._M_end_of_storage,
               (long)&((users.super__Vector_base<User,_std::allocator<User>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage)->username)._M_dataplus._M_p +
               local_d8);
    local_d0._24_8_ = local_a0._8_8_;
    if ((uint *)local_a0._M_allocated_capacity == local_90) {
      uStack_48 = uStack_88;
      uStack_44 = uStack_84;
      username.field_2._8_8_ = local_50;
    }
    else {
      username.field_2._8_8_ = local_a0._M_allocated_capacity;
    }
    local_a0._8_8_ = 0;
    local_90[0] = local_90[0] & 0xffffff00;
    local_d0._16_8_ = local_d0 + 0x20;
    if ((undefined1 *)username.field_2._8_8_ == local_50) {
      local_d0._40_4_ = uStack_48;
      local_d0._44_4_ = uStack_44;
    }
    else {
      local_d0._16_8_ = username.field_2._8_8_;
    }
    local_a0._M_allocated_capacity = (size_type)local_90;
    username.field_2._8_8_ = local_50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&username.field_2 + 8),local_d0._16_8_,
               (undefined1 *)(local_d0._24_8_ + local_d0._16_8_));
    lVar6 = (long)local_40 - password.field_2._8_8_ >> 8;
    __it_00 = password.field_2._8_8_;
    local_34 = socket_fd;
    if (0 < lVar6) {
      lVar6 = lVar6 + 1;
      this = (_Iter_pred<newUser(std::__cxx11::string,int)::__0> *)
             (username.field_2._M_local_buf + 8);
      do {
        bVar2 = __gnu_cxx::__ops::_Iter_pred<newUser(std::__cxx11::string,int)::$_0>::operator()
                          (this,(__normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_>
                                 )__it_00);
        __it._M_current = (anon_struct_64_2_84df61a8 *)__it_00;
        if (bVar2) goto LAB_00106bb1;
        bVar2 = __gnu_cxx::__ops::_Iter_pred<newUser(std::__cxx11::string,int)::$_0>::operator()
                          (this,(anon_struct_64_2_84df61a8 *)(__it_00 + 0x40));
        __it._M_current = (anon_struct_64_2_84df61a8 *)(__it_00 + 0x40);
        if (bVar2) goto LAB_00106bb1;
        bVar2 = __gnu_cxx::__ops::_Iter_pred<newUser(std::__cxx11::string,int)::$_0>::operator()
                          (this,(anon_struct_64_2_84df61a8 *)(__it_00 + 0x80));
        __it._M_current = (anon_struct_64_2_84df61a8 *)(__it_00 + 0x80);
        if (bVar2) goto LAB_00106bb1;
        bVar2 = __gnu_cxx::__ops::_Iter_pred<newUser(std::__cxx11::string,int)::$_0>::operator()
                          (this,(anon_struct_64_2_84df61a8 *)(__it_00 + 0xc0));
        __it._M_current = (anon_struct_64_2_84df61a8 *)(__it_00 + 0xc0);
        if (bVar2) goto LAB_00106bb1;
        __it_00 = __it_00 + 0x100;
        lVar6 = lVar6 + -1;
      } while (1 < lVar6);
    }
    lVar6 = (long)local_40 - __it_00 >> 6;
    if (lVar6 == 1) {
LAB_00106b9b:
      bVar2 = __gnu_cxx::__ops::_Iter_pred<newUser(std::__cxx11::string,int)::$_0>::operator()
                        ((_Iter_pred<newUser(std::__cxx11::string,int)::__0> *)
                         (username.field_2._M_local_buf + 8),
                         (__normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_>)
                         __it_00);
      __it._M_current = local_40;
      if (bVar2) {
        __it._M_current = (anon_struct_64_2_84df61a8 *)__it_00;
      }
    }
    else {
      __it._M_current = (anon_struct_64_2_84df61a8 *)__it_00;
      if (lVar6 == 2) {
LAB_00106b5c:
        bVar2 = __gnu_cxx::__ops::_Iter_pred<newUser(std::__cxx11::string,int)::$_0>::operator()
                          ((_Iter_pred<newUser(std::__cxx11::string,int)::__0> *)
                           (username.field_2._M_local_buf + 8),__it);
        if (!bVar2) {
          __it_00 = __it._M_current + 1;
          goto LAB_00106b9b;
        }
      }
      else {
        __it._M_current = local_40;
        if ((lVar6 == 3) &&
           (bVar2 = __gnu_cxx::__ops::_Iter_pred<newUser(std::__cxx11::string,int)::$_0>::operator()
                              ((_Iter_pred<newUser(std::__cxx11::string,int)::__0> *)
                               (username.field_2._M_local_buf + 8),
                               (__normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_>
                               )__it_00), __it._M_current = (anon_struct_64_2_84df61a8 *)__it_00,
           !bVar2)) {
          __it._M_current = (anon_struct_64_2_84df61a8 *)(__it_00 + 0x40);
          goto LAB_00106b5c;
        }
      }
    }
LAB_00106bb1:
    if ((undefined1 *)username.field_2._8_8_ != local_50) {
      operator_delete((void *)username.field_2._8_8_);
    }
    if ((undefined1 *)local_d0._16_8_ != local_d0 + 0x20) {
      operator_delete((void *)local_d0._16_8_);
    }
    if ((uint *)local_a0._M_allocated_capacity != local_90) {
      operator_delete((void *)local_a0._M_allocated_capacity);
    }
    if (users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (pointer)local_d0) {
      operator_delete(users.super__Vector_base<User,_std::allocator<User>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    }
    if (__it._M_current ==
        users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      std::ios::widen((char)&local_318 + (char)*(undefined8 *)(local_318 + -0x18));
      iVar5 = local_34;
      std::ostream::put((char)&local_318);
      poVar4 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(",1);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_80,(long)username._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_118,(long)password._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
      sVar3 = send(iVar5,"User successfully added!",0x1e,0);
      if (sVar3 == -1) {
        perror("send");
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"User ",5);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_80,(long)username._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," successfully added",0x13);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      iVar5 = 1;
      std::ostream::flush();
    }
    else {
      sVar3 = send(local_34,"User already Exists",0x19,0);
      if (sVar3 == -1) {
        perror("send");
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"User ",5);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_80,(long)username._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," already exists",0xf);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      iVar5 = -1;
      std::ostream::flush();
    }
  }
  else {
    sVar3 = send(socket_fd,"User/password not in bounds",0x1e,0);
    if (sVar3 == -1) {
      perror("send");
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"User ",5);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_80,(long)username._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"out of bounds",0xd);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    iVar5 = -2;
    std::ostream::flush();
  }
  std::vector<User,_std::allocator<User>_>::~vector
            ((vector<User,_std::allocator<User>_> *)((long)&password.field_2 + 8));
LAB_001069bb:
  local_318 = _VTT;
  *(undefined8 *)((long)&local_318 + *(long *)(_VTT + -0x18)) = _perror;
  std::filebuf::~filebuf((filebuf *)&usersFile);
  std::ios_base::~ios_base(local_220);
  if ((size_type *)local_118 != &password._M_string_length) {
    operator_delete(local_118);
  }
  if ((size_type *)local_80 != &username._M_string_length) {
    operator_delete(local_80);
  }
  return iVar5;
}

Assistant:

int newUser(string cmd, int socket_fd){

    //parse the username and password from the command string
    size_t spacePos = cmd.find(" ");
    string username = cmd.substr(0,spacePos);
    string password = cmd.substr(spacePos+1);


    //open the user file
    ofstream usersFile("../users.txt", std::ios_base::app);

    //make sure the file is open
    if(!usersFile.is_open()){
        cerr << "Could not open user.txt file" << endl;
        return -1;
    }

    //get the list of current users
    vector<User> users = getUsers();

    //check that everything is gucci
    if(username.length() < 32 && password.length() > 3 && password.length() < 9){

        //search the currently added users
        auto it = find_if(users.begin(),users.end(),[username](User u){
            return (u.username == username);
        });

        //if it was not found, add the user
        if(it == users.end()){

            //add the new user to the file
            usersFile << endl << "(" << username << ", " << password << ")";

            //send confirmation to client that everythings good
            if(send(socket_fd,"User successfully added!", 30, 0) == -1)
                perror("send");

            //server note
            cout << "User "<< username << " successfully added" << endl;
            return 1;
        }


        //the user already exists
        if(send(socket_fd, "User already Exists",25,0) == -1)
            perror("send");
        cout << "User " << username << " already exists" << endl;
        //return the error
        return USER_EXISTS;

    }

    if(send(socket_fd, "User/password not in bounds",30,0) == -1)
            perror("send");

    cout << "User " << username << "out of bounds" << endl;
    //return the specific error code
    return UP_NOT_IN_BOUNDS;

}